

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_move_to_missing(App *this,Classifier val_type,string *val)

{
  bool bVar1;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  ulong uVar2;
  element_type *peVar3;
  shared_ptr<CLI::App> *subc;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  string *val_local;
  App *pAStack_10;
  Classifier val_type_local;
  App *this_local;
  
  val_local._4_4_ = val_type;
  pAStack_10 = this;
  if (((this->allow_extras_ & 1U) != 0) ||
     (bVar1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
              empty(&this->subcommands_), bVar1)) {
    ::std::
    vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
    ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
              ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                *)&this->missing_,(Classifier *)((long)&val_local + 4),val);
  }
  else {
    __end1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             begin(&this->subcommands_);
    subc = (shared_ptr<CLI::App> *)
           std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                     (&this->subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                       *)&subc), bVar1) {
      this_00 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                ::operator*(&__end1);
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (this_00);
      uVar2 = ::std::__cxx11::string::empty();
      if (((uVar2 & 1) != 0) &&
         (peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(this_00), (peVar3->allow_extras_ & 1U) != 0)) {
        peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_00);
        ::std::
        vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                  ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                    *)&peVar3->missing_,(Classifier *)((long)&val_local + 4),val);
        return;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&__end1);
    }
    ::std::
    vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
    ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
              ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                *)&this->missing_,(Classifier *)((long)&val_local + 4),val);
  }
  return;
}

Assistant:

CLI11_INLINE void App::_move_to_missing(detail::Classifier val_type, const std::string &val) {
    if(allow_extras_ || subcommands_.empty()) {
        missing_.emplace_back(val_type, val);
        return;
    }
    // allow extra arguments to be places in an option group if it is allowed there
    for(auto &subc : subcommands_) {
        if(subc->name_.empty() && subc->allow_extras_) {
            subc->missing_.emplace_back(val_type, val);
            return;
        }
    }
    // if we haven't found any place to put them yet put them in missing
    missing_.emplace_back(val_type, val);
}